

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

Location * __thiscall c4::yml::Parser::val_location(Parser *this,char *val)

{
  pfn_error p_Var1;
  Location LVar2;
  Location LVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  Location LVar7;
  Location LVar8;
  Location LVar9;
  Location LVar10;
  Location LVar11;
  Location LVar12;
  Location LVar13;
  csubstr n;
  size_t sVar14;
  bool bVar15;
  error_flags eVar16;
  char *in_RDX;
  Parser *in_RSI;
  Location *in_RDI;
  char msg_11 [34];
  char msg_10 [70];
  char msg_9 [45];
  lineptr_type it;
  size_t step;
  size_t count;
  lineptr_type last;
  lineptr_type curr;
  size_t offset;
  lineptr_type lineptr;
  char msg_8 [97];
  char msg_7 [51];
  csubstr src;
  char msg_6 [43];
  char msg_5 [45];
  char msg_4 [36];
  char msg_3 [38];
  char msg_2 [55];
  char msg_1 [55];
  char msg [36];
  size_t in_stack_fffffffffffff9f8;
  Location *in_stack_fffffffffffffa00;
  size_t in_stack_fffffffffffffa08;
  Location *in_stack_fffffffffffffa10;
  char *in_stack_fffffffffffffa18;
  Location *in_stack_fffffffffffffa20;
  undefined8 local_500;
  Location *pLStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  size_t local_4e0;
  char local_4d8 [40];
  undefined8 local_4b0;
  Location *pLStack_4a8;
  size_t local_4a0;
  Location *pLStack_498;
  char *local_490;
  char local_488 [72];
  undefined8 local_440;
  Location *pLStack_438;
  size_t local_430;
  Location *pLStack_428;
  char *local_420;
  char local_418 [48];
  ulong *local_3e8;
  ulong local_3e0;
  ulong local_3d8;
  ulong *local_3d0;
  ulong *local_3c8;
  ulong local_3c0;
  ulong *local_3b8;
  undefined8 local_3b0;
  Location *pLStack_3a8;
  size_t local_3a0;
  Location *pLStack_398;
  char *local_390;
  char local_388 [104];
  undefined8 local_320;
  Location *pLStack_318;
  size_t local_310;
  Location *pLStack_308;
  char *local_300;
  char local_2f8 [56];
  ro_substr local_2c0;
  undefined8 local_2b0;
  Location *pLStack_2a8;
  size_t local_2a0;
  Location *pLStack_298;
  char *local_290;
  char local_288 [56];
  undefined8 local_250;
  Location *pLStack_248;
  size_t local_240;
  Location *pLStack_238;
  char *local_230;
  char local_228 [56];
  undefined8 local_1f0;
  Location *pLStack_1e8;
  size_t local_1e0;
  Location *pLStack_1d8;
  char *local_1d0;
  char local_1c8 [40];
  undefined8 local_1a0;
  Location *pLStack_198;
  size_t local_190;
  Location *pLStack_188;
  char *local_180;
  char local_178 [40];
  undefined8 local_150;
  Location *pLStack_148;
  size_t local_140;
  Location *pLStack_138;
  char *local_130;
  char local_128 [56];
  undefined8 local_f0;
  Location *pLStack_e8;
  size_t local_e0;
  Location *pLStack_d8;
  char *local_d0;
  char local_c8 [56];
  undefined8 local_90;
  Location *pLStack_88;
  size_t local_80;
  Location *pLStack_78;
  char *local_70;
  char local_68 [48];
  char *local_38;
  size_t local_30;
  char *local_28;
  ro_substr *local_18;
  ro_substr *local_10;
  ro_substr *local_8;
  
  if (in_RDX == (char *)0x0) {
    local_38 = (in_RSI->m_file).str;
    local_30 = (in_RSI->m_file).len;
    n.len = (size_t)in_stack_fffffffffffffa20;
    n.str = in_stack_fffffffffffffa18;
    Location::Location(in_stack_fffffffffffffa10,n,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
    return in_RDI;
  }
  local_28 = in_RDX;
  bVar15 = ParserOptions::locations(&in_RSI->m_options);
  if (!bVar15) {
    memcpy(local_68,"check failed: m_options.locations()",0x24);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar2.super_LineCol.line = (size_t)pLStack_88;
    LVar2.super_LineCol.offset = local_90;
    LVar2.super_LineCol.col = local_80;
    LVar2.name.str = (char *)pLStack_78;
    LVar2.name.len = (size_t)local_70;
    (*p_Var1)(local_68,0x24,LVar2,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_88;
    in_stack_fffffffffffffa08 = local_80;
    in_stack_fffffffffffffa10 = pLStack_78;
    in_stack_fffffffffffffa18 = local_70;
  }
  if ((in_RSI->m_buf).str != (in_RSI->m_newline_offsets_buf).str) {
    memcpy(local_c8,"check failed: (m_buf.str == m_newline_offsets_buf.str)",0x37);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar3.super_LineCol.line = (size_t)pLStack_e8;
    LVar3.super_LineCol.offset = local_f0;
    LVar3.super_LineCol.col = local_e0;
    LVar3.name.str = (char *)pLStack_d8;
    LVar3.name.len = (size_t)local_d0;
    (*p_Var1)(local_c8,0x37,LVar3,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_e8;
    in_stack_fffffffffffffa08 = local_e0;
    in_stack_fffffffffffffa10 = pLStack_d8;
    in_stack_fffffffffffffa18 = local_d0;
  }
  if ((in_RSI->m_buf).len != (in_RSI->m_newline_offsets_buf).len) {
    memcpy(local_128,"check failed: (m_buf.len == m_newline_offsets_buf.len)",0x37);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar4.super_LineCol.line = (size_t)pLStack_148;
    LVar4.super_LineCol.offset = local_150;
    LVar4.super_LineCol.col = local_140;
    LVar4.name.str = (char *)pLStack_138;
    LVar4.name.len = (size_t)local_130;
    (*p_Var1)(local_128,0x37,LVar4,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_148;
    in_stack_fffffffffffffa08 = local_140;
    in_stack_fffffffffffffa10 = pLStack_138;
    in_stack_fffffffffffffa18 = local_130;
  }
  bVar15 = ParserOptions::locations(&in_RSI->m_options);
  if (!bVar15) {
    memcpy(local_178,"check failed: (m_options.locations())",0x26);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar5.super_LineCol.line = (size_t)pLStack_198;
    LVar5.super_LineCol.offset = local_1a0;
    LVar5.super_LineCol.col = local_190;
    LVar5.name.str = (char *)pLStack_188;
    LVar5.name.len = (size_t)local_180;
    (*p_Var1)(local_178,0x26,LVar5,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_198;
    in_stack_fffffffffffffa08 = local_190;
    in_stack_fffffffffffffa10 = pLStack_188;
    in_stack_fffffffffffffa18 = local_180;
  }
  bVar15 = _locations_dirty(in_RSI);
  if (bVar15) {
    memcpy(local_1c8,"check failed: (!_locations_dirty())",0x24);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar6.super_LineCol.line = (size_t)pLStack_1e8;
    LVar6.super_LineCol.offset = local_1f0;
    LVar6.super_LineCol.col = local_1e0;
    LVar6.name.str = (char *)pLStack_1d8;
    LVar6.name.len = (size_t)local_1d0;
    (*p_Var1)(local_1c8,0x24,LVar6,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_1e8;
    in_stack_fffffffffffffa08 = local_1e0;
    in_stack_fffffffffffffa10 = pLStack_1d8;
    in_stack_fffffffffffffa18 = local_1d0;
  }
  if (in_RSI->m_newline_offsets == (size_t *)0x0) {
    memcpy(local_228,"check failed: (m_newline_offsets != nullptr)",0x2d);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar7.super_LineCol.line = (size_t)pLStack_248;
    LVar7.super_LineCol.offset = local_250;
    LVar7.super_LineCol.col = local_240;
    LVar7.name.str = (char *)pLStack_238;
    LVar7.name.len = (size_t)local_230;
    (*p_Var1)(local_228,0x2d,LVar7,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_248;
    in_stack_fffffffffffffa08 = local_240;
    in_stack_fffffffffffffa10 = pLStack_238;
    in_stack_fffffffffffffa18 = local_230;
  }
  if (in_RSI->m_newline_offsets_size == 0) {
    memcpy(local_288,"check failed: (m_newline_offsets_size > 0)",0x2b);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar8.super_LineCol.line = (size_t)pLStack_2a8;
    LVar8.super_LineCol.offset = local_2b0;
    LVar8.super_LineCol.col = local_2a0;
    LVar8.name.str = (char *)pLStack_298;
    LVar8.name.len = (size_t)local_290;
    (*p_Var1)(local_288,0x2b,LVar8,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_2a8;
    in_stack_fffffffffffffa08 = local_2a0;
    in_stack_fffffffffffffa10 = pLStack_298;
    in_stack_fffffffffffffa18 = local_290;
  }
  local_2c0 = basic_substring::operator_cast_to_basic_substring((basic_substring<char> *)0x3c7dee);
  if ((local_28 == (char *)0x0) && (local_2c0.str != (char *)0x0)) {
    memcpy(local_2f8,"check failed: val != nullptr || src.str == nullptr",0x33);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar9.super_LineCol.line = (size_t)pLStack_318;
    LVar9.super_LineCol.offset = local_320;
    LVar9.super_LineCol.col = local_310;
    LVar9.name.str = (char *)pLStack_308;
    LVar9.name.len = (size_t)local_300;
    (*p_Var1)(local_2f8,0x33,LVar9,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_318;
    in_stack_fffffffffffffa08 = local_310;
    in_stack_fffffffffffffa10 = pLStack_308;
    in_stack_fffffffffffffa18 = local_300;
  }
  local_10 = &local_2c0;
  if (local_2c0.str <= local_28) {
    local_8 = &local_2c0;
    if (local_28 <= local_2c0.str + local_2c0.len) goto LAB_003c800f;
  }
  if ((local_2c0.str != (char *)0x0) || (local_28 != (char *)0x0)) {
    memcpy(local_388,
           "check failed: (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr)"
           ,0x61);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar10.super_LineCol.line = (size_t)pLStack_3a8;
    LVar10.super_LineCol.offset = local_3b0;
    LVar10.super_LineCol.col = local_3a0;
    LVar10.name.str = (char *)pLStack_398;
    LVar10.name.len = (size_t)local_390;
    (*p_Var1)(local_388,0x61,LVar10,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_3a8;
    in_stack_fffffffffffffa08 = local_3a0;
    in_stack_fffffffffffffa10 = pLStack_398;
    in_stack_fffffffffffffa18 = local_390;
  }
LAB_003c800f:
  local_3b8 = (ulong *)0x0;
  local_18 = &local_2c0;
  local_3c0 = (long)local_28 - (long)local_2c0.str;
  if (in_RSI->m_newline_offsets_size < 0x1e) {
    local_3d0 = in_RSI->m_newline_offsets + in_RSI->m_newline_offsets_size;
    for (local_3c8 = in_RSI->m_newline_offsets; local_3c8 < local_3d0; local_3c8 = local_3c8 + 1) {
      if (local_3c0 < *local_3c8) {
        local_3b8 = local_3c8;
        break;
      }
    }
  }
  else {
    local_3b8 = in_RSI->m_newline_offsets;
    sVar14 = in_RSI->m_newline_offsets_size;
    while (local_3d8 = sVar14, local_3d8 != 0) {
      local_3e0 = local_3d8 >> 1;
      local_3e8 = local_3b8 + local_3e0;
      sVar14 = local_3e0;
      if (*local_3e8 < local_3c0) {
        local_3e8 = local_3e8 + 1;
        sVar14 = local_3d8 - (local_3e0 + 1);
        local_3b8 = local_3e8;
      }
    }
  }
  if (local_3b8 < in_RSI->m_newline_offsets) {
    memcpy(local_418,"check failed: (lineptr >= m_newline_offsets)",0x2d);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar11.super_LineCol.line = (size_t)pLStack_438;
    LVar11.super_LineCol.offset = local_440;
    LVar11.super_LineCol.col = local_430;
    LVar11.name.str = (char *)pLStack_428;
    LVar11.name.len = (size_t)local_420;
    (*p_Var1)(local_418,0x2d,LVar11,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_438;
    in_stack_fffffffffffffa08 = local_430;
    in_stack_fffffffffffffa10 = pLStack_428;
    in_stack_fffffffffffffa18 = local_420;
  }
  if (in_RSI->m_newline_offsets + in_RSI->m_newline_offsets_size < local_3b8) {
    memcpy(local_488,"check failed: (lineptr <= m_newline_offsets + m_newline_offsets_size)",0x46);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar12.super_LineCol.line = (size_t)pLStack_4a8;
    LVar12.super_LineCol.offset = local_4b0;
    LVar12.super_LineCol.col = local_4a0;
    LVar12.name.str = (char *)pLStack_498;
    LVar12.name.len = (size_t)local_490;
    (*p_Var1)(local_488,0x46,LVar12,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_4a8;
    in_stack_fffffffffffffa08 = local_4a0;
    in_stack_fffffffffffffa10 = pLStack_498;
    in_stack_fffffffffffffa18 = local_490;
  }
  if (*local_3b8 <= local_3c0) {
    memcpy(local_4d8,"check failed: (*lineptr > offset)",0x22);
    eVar16 = get_error_flags();
    if (((eVar16 & 1) != 0) && (bVar15 = is_debugger_attached(), bVar15)) {
      trap_instruction();
    }
    p_Var1 = (in_RSI->m_stack).m_callbacks.m_error;
    Location::Location(in_stack_fffffffffffffa20,in_stack_fffffffffffffa18,
                       (size_t)in_stack_fffffffffffffa10,in_stack_fffffffffffffa08,
                       (size_t)in_stack_fffffffffffffa00);
    LVar13.super_LineCol.line = (size_t)pLStack_4f8;
    LVar13.super_LineCol.offset = local_500;
    LVar13.super_LineCol.col = local_4f0;
    LVar13.name.str = (char *)uStack_4e8;
    LVar13.name.len = local_4e0;
    (*p_Var1)(local_4d8,0x22,LVar13,(in_RSI->m_stack).m_callbacks.m_user_data);
    in_stack_fffffffffffffa00 = pLStack_4f8;
  }
  Location::Location(in_stack_fffffffffffffa00);
  (in_RDI->name).str = (in_RSI->m_file).str;
  (in_RDI->name).len = (in_RSI->m_file).len;
  (in_RDI->super_LineCol).offset = local_3c0;
  (in_RDI->super_LineCol).line = (long)local_3b8 - (long)in_RSI->m_newline_offsets >> 3;
  if (in_RSI->m_newline_offsets < local_3b8) {
    (in_RDI->super_LineCol).col = (local_3c0 - local_3b8[-1]) - 1;
  }
  else {
    (in_RDI->super_LineCol).col = local_3c0;
  }
  return in_RDI;
}

Assistant:

Location Parser::val_location(const char *val) const
{
    if(C4_UNLIKELY(val == nullptr))
        return {m_file, 0, 0, 0};

    _RYML_CB_CHECK(m_stack.m_callbacks, m_options.locations());
    // NOTE: if any of these checks fails, the parser needs to be
    // instantiated with locations enabled.
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.str == m_newline_offsets_buf.str);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_buf.len == m_newline_offsets_buf.len);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_options.locations());
    _RYML_CB_ASSERT(m_stack.m_callbacks, !_locations_dirty());
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets != nullptr);
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_newline_offsets_size > 0);
    // NOTE: the pointer needs to belong to the buffer that was used to parse.
    csubstr src = m_buf;
    _RYML_CB_CHECK(m_stack.m_callbacks, val != nullptr || src.str == nullptr);
    _RYML_CB_CHECK(m_stack.m_callbacks, (val >= src.begin() && val <= src.end()) || (src.str == nullptr && val == nullptr));
    // ok. search the first stored newline after the given ptr
    using lineptr_type = size_t const* C4_RESTRICT;
    lineptr_type lineptr = nullptr;
    size_t offset = (size_t)(val - src.begin());
    if(m_newline_offsets_size < 30) // TODO magic number
    {
        // just do a linear search if the size is small.
        for(lineptr_type curr = m_newline_offsets, last = m_newline_offsets + m_newline_offsets_size; curr < last; ++curr)
        {
            if(*curr > offset)
            {
                lineptr = curr;
                break;
            }
        }
    }
    else
    {
        // do a bisection search if the size is not small.
        //
        // We could use std::lower_bound but this is simple enough and
        // spares the include of <algorithm>.
        size_t count = m_newline_offsets_size;
        size_t step;
        lineptr_type it;
        lineptr = m_newline_offsets;
        while(count)
        {
            step = count >> 1;
            it = lineptr + step;
            if(*it < offset)
            {
                lineptr = ++it;
                count -= step + 1;
            }
            else
            {
                count = step;
            }
        }
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr >= m_newline_offsets);
    _RYML_CB_ASSERT(m_stack.m_callbacks, lineptr <= m_newline_offsets + m_newline_offsets_size);
    _RYML_CB_ASSERT(m_stack.m_callbacks, *lineptr > offset);
    Location loc;
    loc.name = m_file;
    loc.offset = offset;
    loc.line = (size_t)(lineptr - m_newline_offsets);
    if(lineptr > m_newline_offsets)
        loc.col = (offset - *(lineptr-1) - 1u);
    else
        loc.col = offset;
    return loc;
}